

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result
spvc_compiler_create_compiler_options(spvc_compiler compiler,spvc_compiler_options *options)

{
  size_t *psVar1;
  Options *pOVar2;
  spvc_backend sVar3;
  spvc_context psVar4;
  Compiler *pCVar5;
  undefined8 uVar6;
  size_t sVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  _Head_base<0UL,_ScratchMemoryAllocation_*,_false> _Var14;
  _Head_base<0UL,_ScratchMemoryAllocation_*,_false> _Var15;
  undefined1 *local_68 [2];
  undefined1 local_58 [48];
  
  _Var14._M_head_impl = (ScratchMemoryAllocation *)operator_new(0xd8,(nothrow_t *)&std::nothrow);
  _Var15._M_head_impl = (ScratchMemoryAllocation *)0x0;
  if ((spvc_compiler_options)_Var14._M_head_impl != (spvc_compiler_options)0x0) {
    ((ScratchMemoryAllocation *)&(_Var14._M_head_impl)->_vptr_ScratchMemoryAllocation)->
    _vptr_ScratchMemoryAllocation = (_func_int **)&PTR__ScratchMemoryAllocation_003a89d0;
    _Var14._M_head_impl[1] = (_func_int **)0x0;
    _Var14._M_head_impl[2] = (_func_int **)0x1c200000000;
    *(undefined2 *)&((Options *)(_Var14._M_head_impl + 3))->version = 0;
    *(uint32_t *)((long)(_Var14._M_head_impl + 3) + 4) = 3;
    *(uint32_t *)&_Var14._M_head_impl[4]._vptr_ScratchMemoryAllocation = 0x1000000;
    *(bool *)((long)&_Var14._M_head_impl[4]._vptr_ScratchMemoryAllocation + 4) = false;
    *(bool *)((long)&_Var14._M_head_impl[4]._vptr_ScratchMemoryAllocation + 5) = false;
    *(undefined2 *)((long)&_Var14._M_head_impl[4]._vptr_ScratchMemoryAllocation + 6) = 0x100;
    *(uint32_t *)&_Var14._M_head_impl[5]._vptr_ScratchMemoryAllocation = 0x1000000;
    *(bool *)((long)&_Var14._M_head_impl[5]._vptr_ScratchMemoryAllocation + 4) = false;
    *(bool *)((long)&_Var14._M_head_impl[5]._vptr_ScratchMemoryAllocation + 5) = false;
    *(undefined2 *)((long)&_Var14._M_head_impl[5]._vptr_ScratchMemoryAllocation + 6) = 0;
    *(undefined2 *)&((Options *)(_Var14._M_head_impl + 6))->version = 0;
    *(bool *)((long)(_Var14._M_head_impl + 6) + 2) = true;
    *(FragmentOptions *)((long)(_Var14._M_head_impl + 6) + 4) = (FragmentOptions)0x300000002;
    *(undefined8 *)((long)(_Var14._M_head_impl + 7) + 4) = 0x27d800000001;
    *(undefined8 *)((long)(_Var14._M_head_impl + 8) + 4) = 0x400001000;
    *(undefined8 *)((long)(_Var14._M_head_impl + 9) + 4) = 0x1e0000ffff;
    *(undefined8 *)((long)(_Var14._M_head_impl + 10) + 4) = 0x1c0000001d;
    *(undefined8 *)((long)(_Var14._M_head_impl + 0xb) + 4) = 0x1a0000001b;
    *(undefined8 *)((long)(_Var14._M_head_impl + 0xc) + 4) = 0x1800000019;
    *(undefined8 *)((long)(_Var14._M_head_impl + 0xd) + 4) = 0x1600000017;
    *(undefined8 *)((long)(_Var14._M_head_impl + 0xe) + 4) = 0x1400000015;
    *(undefined8 *)((long)(_Var14._M_head_impl + 0xf) + 4) = 0;
    *(undefined8 *)((long)(_Var14._M_head_impl + 0x10) + 4) = 0xffffffffffffffff;
    *(undefined2 *)((long)(_Var14._M_head_impl + 0x11) + 4) = 0x101;
    *(bool *)((long)(_Var14._M_head_impl + 0x11) + 6) = true;
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x11) + 7) = 0;
    *(undefined2 *)((long)(_Var14._M_head_impl + 0x12) + 3) = 0x100;
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x12) + 5) = 0;
    *(undefined8 *)((long)(_Var14._M_head_impl + 0x13) + 4) = 0;
    *(undefined8 *)((long)(_Var14._M_head_impl + 0x14) + 4) = 0;
    *(bool *)((long)(_Var14._M_head_impl + 0x15) + 4) = true;
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x15) + 5) = 0;
    *(undefined2 *)((long)(_Var14._M_head_impl + 0x16) + 1) = 0;
    *(bool *)((long)(_Var14._M_head_impl + 0x17) + 4) = false;
    *(undefined8 *)((long)(_Var14._M_head_impl + 0x16) + 4) = 0;
    *(undefined8 *)((long)(_Var14._M_head_impl + 0x17) + 5) = 0x1000001;
    ((Options *)(_Var14._M_head_impl + 0x19))->shader_model = 0x1e;
    *(bool *)((long)(_Var14._M_head_impl + 0x1a) + 4) = false;
    *(undefined8 *)((long)(_Var14._M_head_impl + 0x19) + 4) = 0;
    _Var15._M_head_impl = _Var14._M_head_impl;
  }
  psVar4 = compiler->context;
  if (_Var15._M_head_impl == (ScratchMemoryAllocation *)0x0) {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Out of memory.","");
    std::__cxx11::string::operator=((string *)psVar4,(string *)local_68);
    if (psVar4->callback != (spvc_error_callback)0x0) {
      (*psVar4->callback)(psVar4->callback_userdata,(psVar4->last_error)._M_dataplus._M_p);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
  }
  else {
    *(spvc_context *)((long)_Var15._M_head_impl + 8) = psVar4;
    *(uint32_t *)((long)_Var15._M_head_impl + 0x10) = 0;
    sVar3 = compiler->backend;
    if (sVar3 == SPVC_BACKEND_GLSL) {
      *(uint32_t *)((long)_Var15._M_head_impl + 0x10) = 0x3000000;
      pCVar5 = (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
      *(undefined8 *)((long)_Var15._M_head_impl + 0x34) =
           *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x34);
      uVar6 = *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x14);
      uVar8 = *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x1c);
      uVar9 = *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x2c);
      *(undefined8 *)((long)_Var15._M_head_impl + 0x24) =
           *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x24);
      *(undefined8 *)((long)_Var15._M_head_impl + 0x2c) = uVar9;
      *(undefined8 *)((long)_Var15._M_head_impl + 0x14) = uVar6;
      *(undefined8 *)((long)_Var15._M_head_impl + 0x1c) = uVar8;
    }
    else if (sVar3 == SPVC_BACKEND_HLSL) {
      *(uint32_t *)((long)_Var15._M_head_impl + 0x10) = 0x5000000;
      pCVar5 = (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
      *(undefined8 *)((long)_Var15._M_head_impl + 0x34) =
           *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x34);
      uVar6 = *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x14);
      uVar8 = *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x1c);
      uVar9 = *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x2c);
      *(undefined8 *)((long)_Var15._M_head_impl + 0x24) =
           *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x24);
      *(undefined8 *)((long)_Var15._M_head_impl + 0x2c) = uVar9;
      *(undefined8 *)((long)_Var15._M_head_impl + 0x14) = uVar6;
      *(undefined8 *)((long)_Var15._M_head_impl + 0x1c) = uVar8;
      psVar1 = (size_t *)((long)pCVar5[3].ir.ids_for_type + 8);
      uVar10 = *(undefined1 *)((long)psVar1 + 4);
      uVar11 = *(undefined1 *)((long)psVar1 + 5);
      uVar12 = *(undefined1 *)((long)psVar1 + 6);
      uVar13 = *(undefined1 *)((long)psVar1 + 7);
      uVar6 = *(undefined8 *)((long)pCVar5[3].ir.ids_for_type + 0xd);
      pOVar2 = (Options *)((long)_Var15._M_head_impl + 200);
      pOVar2->shader_model = *(undefined4 *)psVar1;
      pOVar2->point_size_compat = (bool)uVar10;
      pOVar2->point_coord_compat = (bool)uVar11;
      pOVar2->support_nonzero_base_vertex_base_instance = (bool)uVar12;
      pOVar2->force_storage_buffer_as_uav = (bool)uVar13;
      *(undefined8 *)((long)_Var15._M_head_impl + 0xcd) = uVar6;
    }
    else if (sVar3 == SPVC_BACKEND_MSL) {
      *(uint32_t *)((long)_Var15._M_head_impl + 0x10) = 0x9000000;
      pCVar5 = (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
      *(undefined8 *)((long)_Var15._M_head_impl + 0x34) =
           *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x34);
      uVar6 = *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x14);
      uVar8 = *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x1c);
      uVar9 = *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x2c);
      *(undefined8 *)((long)_Var15._M_head_impl + 0x24) =
           *(undefined8 *)((long)&pCVar5[2].ir.declared_capabilities + 0x24);
      *(undefined8 *)((long)_Var15._M_head_impl + 0x2c) = uVar9;
      *(undefined8 *)((long)_Var15._M_head_impl + 0x14) = uVar6;
      *(undefined8 *)((long)_Var15._M_head_impl + 0x1c) = uVar8;
      memcpy((Precision *)((long)_Var15._M_head_impl + 0x3c),
             (size_t *)((long)pCVar5[3].ir.ids_for_type + 0xb0),0x89);
    }
    *options = (spvc_compiler_options)_Var15._M_head_impl;
    psVar4 = compiler->context;
    spirv_cross::
    SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
    ::reserve(&psVar4->allocations,
              (psVar4->allocations).
              super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
              .buffer_size + 1);
    sVar7 = (psVar4->allocations).
            super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
            .buffer_size;
    (psVar4->allocations).
    super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
    .ptr[sVar7]._M_t.
    super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>.
    _M_t.
    super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
    .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
         (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)_Var15._M_head_impl;
    (psVar4->allocations).
    super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
    .buffer_size = sVar7 + 1;
  }
  return (uint)(_Var15._M_head_impl != (ScratchMemoryAllocation *)0x0) * 3 +
         SPVC_ERROR_OUT_OF_MEMORY;
}

Assistant:

spvc_result spvc_compiler_create_compiler_options(spvc_compiler compiler, spvc_compiler_options *options)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_compiler_options_s> opt(new (std::nothrow) spvc_compiler_options_s);
		if (!opt)
		{
			compiler->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		opt->context = compiler->context;
		opt->backend_flags = 0;
		switch (compiler->backend)
		{
#if SPIRV_CROSS_C_API_MSL
		case SPVC_BACKEND_MSL:
			opt->backend_flags |= SPVC_COMPILER_OPTION_MSL_BIT | SPVC_COMPILER_OPTION_COMMON_BIT;
			opt->glsl = static_cast<CompilerMSL *>(compiler->compiler.get())->get_common_options();
			opt->msl = static_cast<CompilerMSL *>(compiler->compiler.get())->get_msl_options();
			break;
#endif

#if SPIRV_CROSS_C_API_HLSL
		case SPVC_BACKEND_HLSL:
			opt->backend_flags |= SPVC_COMPILER_OPTION_HLSL_BIT | SPVC_COMPILER_OPTION_COMMON_BIT;
			opt->glsl = static_cast<CompilerHLSL *>(compiler->compiler.get())->get_common_options();
			opt->hlsl = static_cast<CompilerHLSL *>(compiler->compiler.get())->get_hlsl_options();
			break;
#endif

#if SPIRV_CROSS_C_API_GLSL
		case SPVC_BACKEND_GLSL:
			opt->backend_flags |= SPVC_COMPILER_OPTION_GLSL_BIT | SPVC_COMPILER_OPTION_COMMON_BIT;
			opt->glsl = static_cast<CompilerGLSL *>(compiler->compiler.get())->get_common_options();
			break;
#endif

		default:
			break;
		}

		*options = opt.get();
		compiler->context->allocations.push_back(std::move(opt));
	}